

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void InitLexer(Lexer *lexer,char *rawSourceCode)

{
  undefined8 *puVar1;
  size_t sVar2;
  long lVar3;
  
  lexer->rawSourceCode = rawSourceCode;
  sVar2 = strlen(rawSourceCode);
  lexer->length = (int)sVar2;
  lexer->currentTokenString = (char *)0x0;
  (lexer->tracker).tokenStart = 0;
  (lexer->tracker).tokenEnd = 0;
  (lexer->tracker).currentTokenPosition = 0;
  (lexer->tracker).row = 1;
  (lexer->tracker).col = 1;
  lexer->previousTrackerSpot = -1;
  lexer->totalTrackers = 5;
  for (lVar3 = 0x14; lVar3 != 0x78; lVar3 = lVar3 + 0x14) {
    puVar1 = (undefined8 *)
             ((long)&(((Lexer *)(lexer->previousTrackers + -1))->tracker).tokenStart + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)lexer->previousTrackers + lVar3 + -4) = 0;
  }
  return;
}

Assistant:

void InitLexer(Lexer* lexer, char* rawSourceCode){
	// Init lexer
	lexer->rawSourceCode = rawSourceCode;
	lexer->length = strlen(rawSourceCode);
	lexer->currentTokenString = NULL;

	// Init lexer tracker
	lexer->tracker.currentTokenPosition = 0;
	lexer->tracker.tokenStart = 0;
	lexer->tracker.tokenEnd = 0;
	lexer->tracker.row = 1;
	lexer->tracker.col = 1;
	lexer->previousTrackerSpot = -1;
	lexer->totalTrackers = 5;

	for (int i = 0; i < lexer->totalTrackers; i++) {
		lexer->previousTrackers[i].col = 0;
		lexer->previousTrackers[i].row = 0;
		lexer->previousTrackers[i].tokenEnd = 0;
		lexer->previousTrackers[i].tokenStart = 0;
		lexer->previousTrackers[i].currentTokenPosition = 0;
	}
}